

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O0

void printhead(fout f,rnndb *db)

{
  size_t sVar1;
  char *pcVar2;
  uint len_1;
  uint len;
  uint maxlen;
  tm tm;
  stat sb;
  int j;
  int i;
  rnndb *db_local;
  
  stat(f.name,(stat *)&tm.tm_zone);
  gmtime_r(&sb.st_atim.tv_nsec,(tm *)&len);
  fprintf((FILE *)f.file,"#ifndef %s\n",f.guard);
  fprintf((FILE *)f.file,"#define %s\n",f.guard);
  fprintf((FILE *)f.file,"\n");
  fprintf((FILE *)f.file,
          "/* Autogenerated file, DO NOT EDIT manually!\n\nThis file was generated by the rules-ng-ng headergen tool in this git repository:\nhttp://github.com/envytools/envytools/\ngit clone https://github.com/envytools/envytools.git\n\nThe rules-ng-ng source files this header was generated from are:\n"
         );
  len_1 = 0;
  for (sb.__glibc_reserved[2]._4_4_ = 0; sb.__glibc_reserved[2]._4_4_ < db->filesnum;
      sb.__glibc_reserved[2]._4_4_ = sb.__glibc_reserved[2]._4_4_ + 1) {
    sVar1 = strlen(db->files[sb.__glibc_reserved[2]._4_4_]);
    if (len_1 < (uint)sVar1) {
      len_1 = (uint)sVar1;
    }
  }
  for (sb.__glibc_reserved[2]._4_4_ = 0; sb.__glibc_reserved[2]._4_4_ < db->filesnum;
      sb.__glibc_reserved[2]._4_4_ = sb.__glibc_reserved[2]._4_4_ + 1) {
    sVar1 = strlen(db->files[sb.__glibc_reserved[2]._4_4_]);
    fprintf((FILE *)f.file,"- %s%*s ",db->files[sb.__glibc_reserved[2]._4_4_],
            (ulong)(len_1 - (int)sVar1),"");
    print_file_info(f.file,db->files[sb.__glibc_reserved[2]._4_4_]);
  }
  fprintf((FILE *)f.file,"\nCopyright (C) ");
  if (((db->copyright).firstyear != 0) && ((db->copyright).firstyear < tm.tm_mday + 0x76cU)) {
    fprintf((FILE *)f.file,"%u-",(ulong)(db->copyright).firstyear);
  }
  fprintf((FILE *)f.file,"%u",(ulong)(tm.tm_mday + 0x76c));
  if ((db->copyright).authorsnum != 0) {
    fprintf((FILE *)f.file," by the following authors:");
    for (sb.__glibc_reserved[2]._4_4_ = 0; sb.__glibc_reserved[2]._4_4_ < (db->copyright).authorsnum
        ; sb.__glibc_reserved[2]._4_4_ = sb.__glibc_reserved[2]._4_4_ + 1) {
      fprintf((FILE *)f.file,"\n- ");
      if ((db->copyright).authors[sb.__glibc_reserved[2]._4_4_]->name != (char *)0x0) {
        fprintf((FILE *)f.file,"%s",(db->copyright).authors[sb.__glibc_reserved[2]._4_4_]->name);
      }
      if ((db->copyright).authors[sb.__glibc_reserved[2]._4_4_]->email != (char *)0x0) {
        fprintf((FILE *)f.file," <%s>",(db->copyright).authors[sb.__glibc_reserved[2]._4_4_]->email)
        ;
      }
      if ((db->copyright).authors[sb.__glibc_reserved[2]._4_4_]->nicknamesnum != 0) {
        for (sb.__glibc_reserved[2]._0_4_ = 0;
            (int)sb.__glibc_reserved[2] <
            (db->copyright).authors[sb.__glibc_reserved[2]._4_4_]->nicknamesnum;
            sb.__glibc_reserved[2]._0_4_ = (int)sb.__glibc_reserved[2] + 1) {
          pcVar2 = " (";
          if ((int)sb.__glibc_reserved[2] != 0) {
            pcVar2 = ", ";
          }
          fprintf((FILE *)f.file,"%s%s",pcVar2,
                  (db->copyright).authors[sb.__glibc_reserved[2]._4_4_]->nicknames
                  [(int)sb.__glibc_reserved[2]]);
        }
        fprintf((FILE *)f.file,")");
      }
    }
  }
  fprintf((FILE *)f.file,"\n");
  if ((db->copyright).license != (char *)0x0) {
    fprintf((FILE *)f.file,"\n%s\n",(db->copyright).license);
  }
  fprintf((FILE *)f.file,"*/\n\n\n");
  return;
}

Assistant:

void printhead(struct fout f, struct rnndb *db) {
	int i, j;
	struct stat sb;
	struct tm tm;
	stat(f.name, &sb);
	gmtime_r(&sb.st_mtime, &tm);
	fprintf (f.file, "#ifndef %s\n", f.guard);
	fprintf (f.file, "#define %s\n", f.guard);
	fprintf (f.file, "\n");
	fprintf(f.file,
		"/* Autogenerated file, DO NOT EDIT manually!\n"
		"\n"
		"This file was generated by the rules-ng-ng headergen tool in this git repository:\n"
		"http://github.com/envytools/envytools/\n"
		"git clone https://github.com/envytools/envytools.git\n"
		"\n"
		"The rules-ng-ng source files this header was generated from are:\n");
	unsigned maxlen = 0;
	for(i = 0; i < db->filesnum; ++i) {
		unsigned len = strlen(db->files[i]);
		if(len > maxlen)
			maxlen = len;
	}
	for(i = 0; i < db->filesnum; ++i) {
		unsigned len = strlen(db->files[i]);
		fprintf(f.file, "- %s%*s ", db->files[i], maxlen - len, "");
		print_file_info(f.file, db->files[i]);
	}
	fprintf(f.file,
		"\n"
		"Copyright (C) ");
	if(db->copyright.firstyear && db->copyright.firstyear < (1900 + tm.tm_year))
		fprintf(f.file, "%u-", db->copyright.firstyear);
	fprintf(f.file, "%u", 1900 + tm.tm_year);
	if(db->copyright.authorsnum) {
		fprintf(f.file, " by the following authors:");
		for(i = 0; i < db->copyright.authorsnum; ++i) {
			fprintf(f.file, "\n- ");
			if(db->copyright.authors[i]->name)
				fprintf(f.file, "%s", db->copyright.authors[i]->name);
			if(db->copyright.authors[i]->email)
				fprintf(f.file, " <%s>", db->copyright.authors[i]->email);
			if(db->copyright.authors[i]->nicknamesnum) {
				for(j = 0; j < db->copyright.authors[i]->nicknamesnum; ++j) {
					fprintf(f.file, "%s%s", (j ? ", " : " ("), db->copyright.authors[i]->nicknames[j]);
				}
				fprintf(f.file, ")");
			}
		}
	}
	fprintf(f.file, "\n");
	if(db->copyright.license)
		fprintf(f.file, "\n%s\n", db->copyright.license);
	fprintf(f.file, "*/\n\n\n");
}